

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O0

void __thiscall google::protobuf::internal::MicroString::DestroySlow(MicroString *this)

{
  bool bVar1;
  LargeRepKind LVar2;
  MicroRep *p;
  MicroRep *pMVar3;
  size_t sVar4;
  LargeRep *pLVar5;
  LargeRep *pLVar6;
  StringRep *this_00;
  MicroString *this_local;
  
  bVar1 = is_micro_rep(this);
  if (bVar1) {
    p = micro_rep(this);
    pMVar3 = micro_rep(this);
    sVar4 = MicroRepSize((ulong)pMVar3->capacity);
    SizedDelete(p,sVar4);
  }
  else {
    LVar2 = large_rep_kind(this);
    switch(LVar2) {
    case kAlias:
      pLVar5 = large_rep(this);
      if (pLVar5 != (LargeRep *)0x0) {
        operator_delete(pLVar5,0x10);
      }
      break;
    case kUnowned:
      break;
    case kString:
      this_00 = string_rep(this);
      if (this_00 != (StringRep *)0x0) {
        StringRep::~StringRep(this_00);
        operator_delete(this_00,0x30);
      }
      break;
    case kOwned:
      pLVar5 = large_rep(this);
      pLVar6 = large_rep(this);
      sVar4 = OwnedRepSize((ulong)pLVar6->capacity);
      SizedDelete(pLVar5,sVar4);
    }
  }
  return;
}

Assistant:

void MicroString::DestroySlow() {
  if (is_micro_rep()) {
    internal::SizedDelete(micro_rep(), MicroRepSize(micro_rep()->capacity));
    return;
  }

  switch (large_rep_kind()) {
    case kOwned:
      internal::SizedDelete(large_rep(), OwnedRepSize(large_rep()->capacity));
      break;
    case kString:
      delete string_rep();
      break;
    case kAlias:
      delete large_rep();
      break;
    case kUnowned:
      // Nothing to destroy.
      break;
  }
}